

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
::~Storage(Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
           *this)

{
  SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> *pSVar1;
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  pSVar1 = GetSizeAndIsAllocated(this);
  if (*pSVar1 != 0) {
    DeallocateIfAllocated(this);
  }
  container_internal::
  CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_unsigned_long>::
  ~CompressedTuple(&this->metadata_);
  return;
}

Assistant:

~Storage() {
    // Fast path: if we are empty and not allocated, there's nothing to do.
    if (GetSizeAndIsAllocated() == 0) {
      return;
    }

    // Fast path: if no destructors need to be run and we know the allocator
    // doesn't do anything fancy, then all we need to do is deallocate (and
    // maybe not even that).
    if (absl::is_trivially_destructible<ValueType<A>>::value &&
        std::is_same<A, std::allocator<ValueType<A>>>::value) {
      DeallocateIfAllocated();
      return;
    }

    DestroyContents();
  }